

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Basic.cpp
# Opt level: O0

void __thiscall
ObserverManager_TwoProtocolsAutoUnsubscribe_Test::TestBody
          (ObserverManager_TwoProtocolsAutoUnsubscribe_Test *this)

{
  bool bVar1;
  B *this_00;
  char *message;
  AssertHelper local_210;
  Message local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar;
  B *b;
  stringstream out;
  ostream local_188 [376];
  ObserverManager_TwoProtocolsAutoUnsubscribe_Test *local_10;
  ObserverManager_TwoProtocolsAutoUnsubscribe_Test *this_local;
  
  local_10 = this;
  std::__cxx11::stringstream::stringstream((stringstream *)&b);
  this_00 = (B *)operator_new(0x28);
  B::B(this_00,local_188);
  ObserverManager::subscribe<TicTacProtocol,B>(this_00);
  ObserverManager::subscribe<FooBarProtocol,B>(this_00);
  if (this_00 != (B *)0x0) {
    (*(this_00->super_FooBarProtocol).super_BaseObserverProtocol._vptr_BaseObserverProtocol[1])();
  }
  ObserverManager::notify<TicTacProtocol>((ObserverManager *)0x11,0);
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x19
  ;
  ObserverManager::notify<FooBarProtocol,std::__cxx11::string_const&,char_const*>
            ((ObserverManager *)0x19,0,"Toe");
  std::__cxx11::stringstream::str();
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_1e0,"\"\"","out.str()",(char (*) [1])0x1b78f2,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar1) {
    testing::Message::Message(&local_208);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/fnz[P]ObserverManager/Tests/Basic.cpp"
               ,0x46,message);
    testing::internal::AssertHelper::operator=(&local_210,&local_208);
    testing::internal::AssertHelper::~AssertHelper(&local_210);
    testing::Message::~Message(&local_208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&b);
  return;
}

Assistant:

TEST(ObserverManager, TwoProtocolsAutoUnsubscribe) {
    std::stringstream out;
    
    B* b = new B(out);
    ObserverManager::subscribe<TicTacProtocol>(b);
    ObserverManager::subscribe<FooBarProtocol>(b);
    
    delete b;
    
    ObserverManager::notify(&TicTacProtocol::ticTac);
    ObserverManager::notify(&FooBarProtocol::bar, "Toe");
    
    EXPECT_EQ("", out.str());
}